

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-backend-ops.cpp
# Opt level: O1

void __thiscall test_get_rows_back::initialize_tensors(test_get_rows_back *this,ggml_context *ctx)

{
  uint uVar1;
  int iVar2;
  int *piVar3;
  ulong uVar4;
  long lVar5;
  vector<int,_std::allocator<int>_> data;
  float in_stack_ffffffffffffffa8;
  float in_stack_ffffffffffffffac;
  allocator_type local_49;
  vector<int,_std::allocator<int>_> local_48;
  
  piVar3 = (int *)ggml_get_first_tensor(ctx);
  if (piVar3 != (int *)0x0) {
    do {
      if (*piVar3 == 0x1a) {
        if (3 < piVar3[0x14] - 0x22U) {
          std::vector<int,_std::allocator<int>_>::vector
                    (&local_48,(long)this->b * (long)this->r,&local_49);
          uVar1 = this->b * this->r;
          uVar4 = (ulong)uVar1;
          if (0 < (int)uVar1) {
            lVar5 = 0;
            do {
              iVar2 = rand();
              local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start[lVar5] = iVar2 % this->m;
              lVar5 = lVar5 + 1;
              uVar4 = (long)this->b * (long)this->r;
            } while (lVar5 < (long)uVar4);
          }
          ggml_backend_tensor_set
                    (piVar3,local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start,0,(long)(int)uVar4 << 2);
          if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start != (pointer)0x0) {
            operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage -
                            (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start);
          }
        }
      }
      else {
        init_tensor_uniform((ggml_tensor *)0x12104b,in_stack_ffffffffffffffac,
                            in_stack_ffffffffffffffa8);
      }
      piVar3 = (int *)ggml_get_next_tensor(ctx,piVar3);
    } while (piVar3 != (int *)0x0);
  }
  return;
}

Assistant:

void initialize_tensors(ggml_context * ctx) override {
        for (ggml_tensor * t = ggml_get_first_tensor(ctx); t != NULL; t = ggml_get_next_tensor(ctx, t)) {
            if (t->type == GGML_TYPE_I32) {
                if (ggml_is_view_op(t->op)) { continue; }
                // rows
                std::vector<int> data(r*b);
                for (int i = 0; i < r*b; i++) {
                    data[i] = rand() % m;
                }
                ggml_backend_tensor_set(t, data.data(), 0, r * b * sizeof(int));
            } else {
                init_tensor_uniform(t);
            }
        }
    }